

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O0

void __thiscall
Assimp::PLYImporter::LoadMaterial
          (PLYImporter *this,vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *pvOut,
          string *defaultTexture,bool pointsOnly)

{
  bool bVar1;
  reference pEVar2;
  reference pPVar3;
  aiMaterial *paVar4;
  reference pEVar5;
  PropertyInstance *pPVar6;
  const_reference pvVar7;
  ulong uVar8;
  char *pcVar9;
  int local_9b8;
  allocator<char> local_9b1;
  int wireframe_1;
  undefined1 local_990 [8];
  aiString name_1;
  int two_sided_2;
  aiColor3D clr;
  int iMode_1;
  aiMaterial *pcHelper_1;
  int local_568;
  int wireframe;
  int two_sided_1;
  undefined1 local_540 [8];
  aiString name;
  int two_sided;
  float local_12c;
  ValueUnion VStack_128;
  ai_real fOpacity;
  float local_11c;
  int local_118;
  ai_real fSpec;
  int iMode;
  aiMaterial *local_108;
  aiMaterial *pcHelper;
  aiColor4D clrOut;
  __normal_iterator<Assimp::PLY::ElementInstance_*,_std::vector<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>_>
  local_e8;
  __normal_iterator<const_Assimp::PLY::ElementInstance_*,_std::vector<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>_>
  local_e0;
  const_iterator i_1;
  __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
  local_d0;
  const_iterator a;
  iterator iStack_c0;
  uint _a;
  __normal_iterator<Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
  local_b8;
  __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
  local_b0;
  const_iterator i;
  EDataType local_a0;
  uint _i;
  EDataType eOpacity;
  uint iOpacity;
  EDataType ePhong;
  uint iPhong;
  ElementInstanceList *pcList;
  EDataType aaiTypes [3] [4];
  uint aaiPositions [3] [4];
  bool pointsOnly_local;
  string *defaultTexture_local;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *pvOut_local;
  PLYImporter *this_local;
  
  aaiPositions[2][3]._3_1_ = pointsOnly;
  if (pvOut == (vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)0x0) {
    __assert_fail("__null != pvOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyLoader.cpp"
                  ,0x2d5,
                  "void Assimp::PLYImporter::LoadMaterial(std::vector<aiMaterial *> *, std::string &, const bool)"
                 );
  }
  memset(aaiTypes[2] + 2,0xff,0x30);
  memset(&pcList,0,0x30);
  _ePhong = (reference)0x0;
  iOpacity = 0xffffffff;
  eOpacity = EDT_Char;
  _i = 0xffffffff;
  local_a0 = EDT_Char;
  i._M_current._4_4_ = 0;
  local_b8._M_current =
       (Element *)
       std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>::begin
                 (&this->pcDOM->alElements);
  __gnu_cxx::
  __normal_iterator<Assimp::PLY::Element_const*,std::vector<Assimp::PLY::Element,std::allocator<Assimp::PLY::Element>>>
  ::__normal_iterator<Assimp::PLY::Element*>
            ((__normal_iterator<Assimp::PLY::Element_const*,std::vector<Assimp::PLY::Element,std::allocator<Assimp::PLY::Element>>>
              *)&local_b0,&local_b8);
  while( true ) {
    iStack_c0 = std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>::end
                          (&this->pcDOM->alElements);
    bVar1 = __gnu_cxx::operator!=(&local_b0,&stack0xffffffffffffff40);
    if (!bVar1) goto LAB_005debe5;
    pEVar2 = __gnu_cxx::
             __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
             ::operator*(&local_b0);
    if (pEVar2->eSemantic == EEST_Material) break;
    pEVar2 = __gnu_cxx::
             __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
             ::operator*(&local_b0);
    if (pEVar2->eSemantic == EEST_TextureFile) {
      pEVar2 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
               ::operator*(&local_b0);
      std::__cxx11::string::operator=((string *)defaultTexture,(string *)&pEVar2->szName);
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
    ::operator++(&local_b0);
    i._M_current._4_4_ = i._M_current._4_4_ + 1;
  }
  _ePhong = std::
            vector<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
            ::operator[](&this->pcDOM->alElementData,(ulong)i._M_current._4_4_);
  a._M_current._4_4_ = EDT_Char;
  pEVar2 = __gnu_cxx::
           __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
           ::operator*(&local_b0);
  local_d0._M_current =
       (Property *)
       std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>::begin
                 (&pEVar2->alProperties);
  while( true ) {
    pEVar2 = __gnu_cxx::
             __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
             ::operator*(&local_b0);
    i_1._M_current =
         (ElementInstance *)
         std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>::end
                   (&pEVar2->alProperties);
    bVar1 = __gnu_cxx::operator!=
                      (&local_d0,
                       (__normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                        *)&i_1);
    if (!bVar1) break;
    pPVar3 = __gnu_cxx::
             __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
             ::operator*(&local_d0);
    if ((pPVar3->bIsList & 1U) == 0) {
      pPVar3 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
               ::operator*(&local_d0);
      if (pPVar3->Semantic == EST_PhongPower) {
        iOpacity = a._M_current._4_4_;
        pPVar3 = __gnu_cxx::
                 __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                 ::operator*(&local_d0);
        eOpacity = pPVar3->eType;
      }
      pPVar3 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
               ::operator*(&local_d0);
      if (pPVar3->Semantic == EST_Opacity) {
        _i = a._M_current._4_4_;
        pPVar3 = __gnu_cxx::
                 __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                 ::operator*(&local_d0);
        local_a0 = pPVar3->eType;
      }
      pPVar3 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
               ::operator*(&local_d0);
      if (pPVar3->Semantic == EST_DiffuseRed) {
        aaiTypes[2][2] = a._M_current._4_4_;
        pPVar3 = __gnu_cxx::
                 __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                 ::operator*(&local_d0);
        pcList._0_4_ = pPVar3->eType;
      }
      else {
        pPVar3 = __gnu_cxx::
                 __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                 ::operator*(&local_d0);
        if (pPVar3->Semantic == EST_DiffuseGreen) {
          aaiTypes[2][3] = a._M_current._4_4_;
          pPVar3 = __gnu_cxx::
                   __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                   ::operator*(&local_d0);
          pcList._4_4_ = pPVar3->eType;
        }
        else {
          pPVar3 = __gnu_cxx::
                   __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                   ::operator*(&local_d0);
          if (pPVar3->Semantic == EST_DiffuseBlue) {
            aaiPositions[0][0] = a._M_current._4_4_;
            pPVar3 = __gnu_cxx::
                     __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                     ::operator*(&local_d0);
            aaiTypes[0][0] = pPVar3->eType;
          }
          else {
            pPVar3 = __gnu_cxx::
                     __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                     ::operator*(&local_d0);
            if (pPVar3->Semantic == EST_DiffuseAlpha) {
              aaiPositions[0][1] = a._M_current._4_4_;
              pPVar3 = __gnu_cxx::
                       __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                       ::operator*(&local_d0);
              aaiTypes[0][1] = pPVar3->eType;
            }
            else {
              pPVar3 = __gnu_cxx::
                       __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                       ::operator*(&local_d0);
              if (pPVar3->Semantic == EST_SpecularRed) {
                aaiPositions[0][2] = a._M_current._4_4_;
                pPVar3 = __gnu_cxx::
                         __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                         ::operator*(&local_d0);
                aaiTypes[0][2] = pPVar3->eType;
              }
              else {
                pPVar3 = __gnu_cxx::
                         __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                         ::operator*(&local_d0);
                if (pPVar3->Semantic == EST_SpecularGreen) {
                  aaiPositions[0][3] = a._M_current._4_4_;
                  pPVar3 = __gnu_cxx::
                           __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                           ::operator*(&local_d0);
                  aaiTypes[0][3] = pPVar3->eType;
                }
                else {
                  pPVar3 = __gnu_cxx::
                           __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                           ::operator*(&local_d0);
                  if (pPVar3->Semantic == EST_SpecularBlue) {
                    aaiPositions[1][0] = a._M_current._4_4_;
                    pPVar3 = __gnu_cxx::
                             __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                             ::operator*(&local_d0);
                    aaiTypes[1][0] = pPVar3->eType;
                  }
                  else {
                    pPVar3 = __gnu_cxx::
                             __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                             ::operator*(&local_d0);
                    if (pPVar3->Semantic == EST_SpecularAlpha) {
                      aaiPositions[1][1] = a._M_current._4_4_;
                      pPVar3 = __gnu_cxx::
                               __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                               ::operator*(&local_d0);
                      aaiTypes[1][1] = pPVar3->eType;
                    }
                    else {
                      pPVar3 = __gnu_cxx::
                               __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                               ::operator*(&local_d0);
                      if (pPVar3->Semantic == EST_AmbientRed) {
                        aaiPositions[1][2] = a._M_current._4_4_;
                        pPVar3 = __gnu_cxx::
                                 __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                                 ::operator*(&local_d0);
                        aaiTypes[1][2] = pPVar3->eType;
                      }
                      else {
                        pPVar3 = __gnu_cxx::
                                 __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                                 ::operator*(&local_d0);
                        if (pPVar3->Semantic == EST_AmbientGreen) {
                          aaiPositions[1][3] = a._M_current._4_4_;
                          pPVar3 = __gnu_cxx::
                                   __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                                   ::operator*(&local_d0);
                          aaiTypes[1][3] = pPVar3->eType;
                        }
                        else {
                          pPVar3 = __gnu_cxx::
                                   __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                                   ::operator*(&local_d0);
                          if (pPVar3->Semantic == EST_AmbientBlue) {
                            aaiPositions[2][0] = a._M_current._4_4_;
                            pPVar3 = __gnu_cxx::
                                     __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                                     ::operator*(&local_d0);
                            aaiTypes[2][0] = pPVar3->eType;
                          }
                          else {
                            pPVar3 = __gnu_cxx::
                                     __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                                     ::operator*(&local_d0);
                            if (pPVar3->Semantic == EST_AmbientAlpha) {
                              aaiPositions[2][1] = a._M_current._4_4_;
                              pPVar3 = __gnu_cxx::
                                       __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                                       ::operator*(&local_d0);
                              aaiTypes[2][1] = pPVar3->eType;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
    ::operator++(&local_d0);
    a._M_current._4_4_ = a._M_current._4_4_ + EDT_UChar;
  }
LAB_005debe5:
  if (_ePhong == (reference)0x0) {
    paVar4 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(paVar4);
    clr.g = 2.8026e-45;
    unique0x10000eb8 = paVar4;
    aiMaterial::AddProperty<int>(paVar4,(int *)&clr.g,1,"$mat.shadingm",0,0);
    aiColor3D::aiColor3D((aiColor3D *)(name_1.data + 0x3fc));
    name_1.data[0x3fc] = '\0';
    name_1.data[0x3fd] = '\0';
    name_1.data[0x3fe] = -0x80;
    name_1.data[0x3ff] = '?';
    clr.r = 1.0;
    aiMaterial::AddProperty<aiColor3D>
              (stack0xfffffffffffffa88,(aiColor3D *)(name_1.data + 0x3fc),1,"$clr.diffuse",0,0);
    aiMaterial::AddProperty<aiColor3D>
              (stack0xfffffffffffffa88,(aiColor3D *)(name_1.data + 0x3fc),1,"$clr.specular",0,0);
    name_1.data[0x3fc] = '\0';
    name_1.data[0x3fd] = '\0';
    name_1.data[0x3fe] = -0x80;
    name_1.data[0x3ff] = '?';
    clr.r = 1.0;
    aiMaterial::AddProperty<aiColor3D>
              (stack0xfffffffffffffa88,(aiColor3D *)(name_1.data + 0x3fc),1,"$clr.ambient",0,0);
    if ((aaiPositions[2][3]._3_1_ & 1) == 0) {
      name_1.data[0x3f8] = '\x01';
      name_1.data[0x3f9] = '\0';
      name_1.data[0x3fa] = '\0';
      name_1.data[0x3fb] = '\0';
      aiMaterial::AddProperty
                (stack0xfffffffffffffa88,(int *)(name_1.data + 0x3f8),1,"$mat.twosided",0,0);
    }
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      pcVar9 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&wireframe_1,pcVar9,&local_9b1);
      aiString::aiString((aiString *)local_990,(string *)&wireframe_1);
      std::__cxx11::string::~string((string *)&wireframe_1);
      std::allocator<char>::~allocator(&local_9b1);
      aiMaterial::AddProperty(stack0xfffffffffffffa88,(aiString *)local_990,"$tex.file",1,0);
    }
    if ((aaiPositions[2][3]._3_1_ & 1) != 0) {
      local_9b8 = 1;
      aiMaterial::AddProperty(stack0xfffffffffffffa88,&local_9b8,1,"$mat.wireframe",0,0);
    }
    std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back(pvOut,(value_type *)&clr.b);
  }
  else {
    local_e8._M_current =
         (ElementInstance *)
         std::vector<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>::
         begin(&_ePhong->alInstances);
    __gnu_cxx::
    __normal_iterator<Assimp::PLY::ElementInstance_const*,std::vector<Assimp::PLY::ElementInstance,std::allocator<Assimp::PLY::ElementInstance>>>
    ::__normal_iterator<Assimp::PLY::ElementInstance*>
              ((__normal_iterator<Assimp::PLY::ElementInstance_const*,std::vector<Assimp::PLY::ElementInstance,std::allocator<Assimp::PLY::ElementInstance>>>
                *)&local_e0,&local_e8);
    while( true ) {
      clrOut._8_8_ = std::
                     vector<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                     ::end(&_ePhong->alInstances);
      bVar1 = __gnu_cxx::operator!=
                        (&local_e0,
                         (__normal_iterator<Assimp::PLY::ElementInstance_*,_std::vector<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>_>
                          *)&clrOut.b);
      if (!bVar1) break;
      aiColor4t<float>::aiColor4t((aiColor4t<float> *)&pcHelper);
      paVar4 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(paVar4);
      local_108 = paVar4;
      pEVar5 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::ElementInstance_*,_std::vector<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>_>
               ::operator*(&local_e0);
      GetMaterialColor(&pEVar5->alProperties,aaiTypes[2] + 2,(EDataType *)&pcList,
                       (aiColor4D *)&pcHelper);
      aiMaterial::AddProperty<aiColor4t<float>>
                (local_108,(aiColor4D *)&pcHelper,1,"$clr.diffuse",0,0);
      pEVar5 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::ElementInstance_*,_std::vector<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>_>
               ::operator*(&local_e0);
      GetMaterialColor(&pEVar5->alProperties,aaiPositions[0] + 2,aaiTypes[0] + 2,
                       (aiColor4D *)&pcHelper);
      aiMaterial::AddProperty<aiColor4t<float>>
                (local_108,(aiColor4D *)&pcHelper,1,"$clr.specular",0,0);
      pEVar5 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::ElementInstance_*,_std::vector<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>_>
               ::operator*(&local_e0);
      GetMaterialColor(&pEVar5->alProperties,aaiPositions[1] + 2,aaiTypes[1] + 2,
                       (aiColor4D *)&pcHelper);
      aiMaterial::AddProperty<aiColor4t<float>>
                (local_108,(aiColor4D *)&pcHelper,1,"$clr.ambient",0,0);
      local_118 = 2;
      if (iOpacity != 0xffffffff) {
        pEVar5 = __gnu_cxx::
                 __normal_iterator<const_Assimp::PLY::ElementInstance_*,_std::vector<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>_>
                 ::operator*(&local_e0);
        pPVar6 = anon_unknown.dwarf_7bd600::GetProperty<Assimp::PLY::PropertyInstance>
                           (&pEVar5->alProperties,iOpacity);
        pvVar7 = std::
                 vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                 ::front(&pPVar6->avList);
        VStack_128 = *pvVar7;
        local_11c = PLY::PropertyInstance::ConvertTo<float>(VStack_128,eOpacity);
        if ((local_11c != 0.0) || (NAN(local_11c))) {
          local_11c = local_11c * 15.0;
          aiMaterial::AddProperty<float>(local_108,&local_11c,1,"$mat.shininess",0,0);
          local_118 = 3;
        }
      }
      aiMaterial::AddProperty<int>(local_108,&local_118,1,"$mat.shadingm",0,0);
      if (_i != 0xffffffff) {
        pEVar5 = __gnu_cxx::
                 __normal_iterator<const_Assimp::PLY::ElementInstance_*,_std::vector<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>_>
                 ::operator*(&local_e0);
        pPVar6 = anon_unknown.dwarf_7bd600::GetProperty<Assimp::PLY::PropertyInstance>
                           (&pEVar5->alProperties,iOpacity);
        pvVar7 = std::
                 vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                 ::front(&pPVar6->avList);
        unique0x00012000 = *pvVar7;
        local_12c = PLY::PropertyInstance::ConvertTo<float>(unique0x00012000,local_a0);
        aiMaterial::AddProperty<float>(local_108,&local_12c,1,"$mat.opacity",0,0);
      }
      name.data[0x3f8] = '\x01';
      name.data[0x3f9] = '\0';
      name.data[0x3fa] = '\0';
      name.data[0x3fb] = '\0';
      aiMaterial::AddProperty(local_108,(int *)(name.data + 0x3f8),1,"$mat.twosided",0,0);
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        pcVar9 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&two_sided_1,pcVar9,(allocator<char> *)((long)&wireframe + 3));
        aiString::aiString((aiString *)local_540,(string *)&two_sided_1);
        std::__cxx11::string::~string((string *)&two_sided_1);
        std::allocator<char>::~allocator((allocator<char> *)((long)&wireframe + 3));
        aiMaterial::AddProperty(local_108,(aiString *)local_540,"$tex.file",1,0);
      }
      if ((aaiPositions[2][3]._3_1_ & 1) == 0) {
        local_568 = 1;
        aiMaterial::AddProperty(local_108,&local_568,1,"$mat.twosided",0,0);
      }
      if ((aaiPositions[2][3]._3_1_ & 1) != 0) {
        pcHelper_1._4_4_ = 1;
        aiMaterial::AddProperty(local_108,(int *)((long)&pcHelper_1 + 4),1,"$mat.wireframe",0,0);
      }
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back(pvOut,&local_108);
      __gnu_cxx::
      __normal_iterator<const_Assimp::PLY::ElementInstance_*,_std::vector<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>_>
      ::operator++(&local_e0);
    }
  }
  return;
}

Assistant:

void PLYImporter::LoadMaterial(std::vector<aiMaterial*>* pvOut, std::string &defaultTexture, const bool pointsOnly)
{
  ai_assert(NULL != pvOut);

  // diffuse[4], specular[4], ambient[4]
  // rgba order
  unsigned int aaiPositions[3][4] = {

    { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF },
    { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF },
    { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF },
  };

  PLY::EDataType aaiTypes[3][4] = {
    { EDT_Char, EDT_Char, EDT_Char, EDT_Char },
    { EDT_Char, EDT_Char, EDT_Char, EDT_Char },
    { EDT_Char, EDT_Char, EDT_Char, EDT_Char }
  };
  PLY::ElementInstanceList* pcList = NULL;

  unsigned int iPhong = 0xFFFFFFFF;
  PLY::EDataType ePhong = EDT_Char;

  unsigned int iOpacity = 0xFFFFFFFF;
  PLY::EDataType eOpacity = EDT_Char;

  // search in the DOM for a vertex entry
  unsigned int _i = 0;
  for (std::vector<PLY::Element>::const_iterator i = this->pcDOM->alElements.begin();
    i != this->pcDOM->alElements.end(); ++i, ++_i)
  {
    if (PLY::EEST_Material == (*i).eSemantic)
    {
      pcList = &this->pcDOM->alElementData[_i];

      // now check whether which coordinate sets are available
      unsigned int _a = 0;
      for (std::vector<PLY::Property>::const_iterator
        a = (*i).alProperties.begin();
        a != (*i).alProperties.end(); ++a, ++_a)
      {
        if ((*a).bIsList)continue;

        // pohng specularity      -----------------------------------
        if (PLY::EST_PhongPower == (*a).Semantic)
        {
          iPhong = _a;
          ePhong = (*a).eType;
        }

        // general opacity        -----------------------------------
        if (PLY::EST_Opacity == (*a).Semantic)
        {
          iOpacity = _a;
          eOpacity = (*a).eType;
        }

        // diffuse color channels -----------------------------------
        if (PLY::EST_DiffuseRed == (*a).Semantic)
        {
          aaiPositions[0][0] = _a;
          aaiTypes[0][0] = (*a).eType;
        }
        else if (PLY::EST_DiffuseGreen == (*a).Semantic)
        {
          aaiPositions[0][1] = _a;
          aaiTypes[0][1] = (*a).eType;
        }
        else if (PLY::EST_DiffuseBlue == (*a).Semantic)
        {
          aaiPositions[0][2] = _a;
          aaiTypes[0][2] = (*a).eType;
        }
        else if (PLY::EST_DiffuseAlpha == (*a).Semantic)
        {
          aaiPositions[0][3] = _a;
          aaiTypes[0][3] = (*a).eType;
        }
        // specular color channels -----------------------------------
        else if (PLY::EST_SpecularRed == (*a).Semantic)
        {
          aaiPositions[1][0] = _a;
          aaiTypes[1][0] = (*a).eType;
        }
        else if (PLY::EST_SpecularGreen == (*a).Semantic)
        {
          aaiPositions[1][1] = _a;
          aaiTypes[1][1] = (*a).eType;
        }
        else if (PLY::EST_SpecularBlue == (*a).Semantic)
        {
          aaiPositions[1][2] = _a;
          aaiTypes[1][2] = (*a).eType;
        }
        else if (PLY::EST_SpecularAlpha == (*a).Semantic)
        {
          aaiPositions[1][3] = _a;
          aaiTypes[1][3] = (*a).eType;
        }
        // ambient color channels -----------------------------------
        else if (PLY::EST_AmbientRed == (*a).Semantic)
        {
          aaiPositions[2][0] = _a;
          aaiTypes[2][0] = (*a).eType;
        }
        else if (PLY::EST_AmbientGreen == (*a).Semantic)
        {
          aaiPositions[2][1] = _a;
          aaiTypes[2][1] = (*a).eType;
        }
        else if (PLY::EST_AmbientBlue == (*a).Semantic)
        {
          aaiPositions[2][2] = _a;
          aaiTypes[2][2] = (*a).eType;
        }
        else if (PLY::EST_AmbientAlpha == (*a).Semantic)
        {
          aaiPositions[2][3] = _a;
          aaiTypes[2][3] = (*a).eType;
        }
      }
      break;
    }
    else if (PLY::EEST_TextureFile == (*i).eSemantic)
    {
      defaultTexture = (*i).szName;
    }
  }
  // check whether we have a valid source for the material data
  if (NULL != pcList) {
    for (std::vector<ElementInstance>::const_iterator i = pcList->alInstances.begin(); i != pcList->alInstances.end(); ++i)  {
      aiColor4D clrOut;
      aiMaterial* pcHelper = new aiMaterial();

      // build the diffuse material color
      GetMaterialColor((*i).alProperties, aaiPositions[0], aaiTypes[0], &clrOut);
      pcHelper->AddProperty<aiColor4D>(&clrOut, 1, AI_MATKEY_COLOR_DIFFUSE);

      // build the specular material color
      GetMaterialColor((*i).alProperties, aaiPositions[1], aaiTypes[1], &clrOut);
      pcHelper->AddProperty<aiColor4D>(&clrOut, 1, AI_MATKEY_COLOR_SPECULAR);

      // build the ambient material color
      GetMaterialColor((*i).alProperties, aaiPositions[2], aaiTypes[2], &clrOut);
      pcHelper->AddProperty<aiColor4D>(&clrOut, 1, AI_MATKEY_COLOR_AMBIENT);

      // handle phong power and shading mode
      int iMode = (int)aiShadingMode_Gouraud;
      if (0xFFFFFFFF != iPhong)   {
        ai_real fSpec = PLY::PropertyInstance::ConvertTo<ai_real>(GetProperty((*i).alProperties, iPhong).avList.front(), ePhong);

        // if shininess is 0 (and the pow() calculation would therefore always
        // become 1, not depending on the angle), use gouraud lighting
        if (fSpec)  {
          // scale this with 15 ... hopefully this is correct
          fSpec *= 15;
          pcHelper->AddProperty<ai_real>(&fSpec, 1, AI_MATKEY_SHININESS);

          iMode = (int)aiShadingMode_Phong;
        }
      }
      pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

      // handle opacity
      if (0xFFFFFFFF != iOpacity) {
        ai_real fOpacity = PLY::PropertyInstance::ConvertTo<ai_real>(GetProperty((*i).alProperties, iPhong).avList.front(), eOpacity);
        pcHelper->AddProperty<ai_real>(&fOpacity, 1, AI_MATKEY_OPACITY);
      }

      // The face order is absolutely undefined for PLY, so we have to
      // use two-sided rendering to be sure it's ok.
      const int two_sided = 1;
      pcHelper->AddProperty(&two_sided, 1, AI_MATKEY_TWOSIDED);

      //default texture
      if (!defaultTexture.empty())
      {
        const aiString name(defaultTexture.c_str());
        pcHelper->AddProperty(&name, _AI_MATKEY_TEXTURE_BASE, aiTextureType_DIFFUSE, 0);
      }

      if (!pointsOnly)
      {
        const int two_sided = 1;
        pcHelper->AddProperty(&two_sided, 1, AI_MATKEY_TWOSIDED);
      }

      //set to wireframe, so when using this material info we can switch to points rendering
      if (pointsOnly)
      {
        const int wireframe = 1;
        pcHelper->AddProperty(&wireframe, 1, AI_MATKEY_ENABLE_WIREFRAME);
      }

      // add the newly created material instance to the list
      pvOut->push_back(pcHelper);
    }
  }
  else
  {
    // generate a default material
    aiMaterial* pcHelper = new aiMaterial();

    // fill in a default material
    int iMode = (int)aiShadingMode_Gouraud;
    pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

    //generate white material most 3D engine just multiply ambient / diffuse color with actual ambient / light color
    aiColor3D clr;
    clr.b = clr.g = clr.r = 1.0f;
    pcHelper->AddProperty<aiColor3D>(&clr, 1, AI_MATKEY_COLOR_DIFFUSE);
    pcHelper->AddProperty<aiColor3D>(&clr, 1, AI_MATKEY_COLOR_SPECULAR);

    clr.b = clr.g = clr.r = 1.0f;
    pcHelper->AddProperty<aiColor3D>(&clr, 1, AI_MATKEY_COLOR_AMBIENT);

    // The face order is absolutely undefined for PLY, so we have to
    // use two-sided rendering to be sure it's ok.
    if (!pointsOnly)
    {
      const int two_sided = 1;
      pcHelper->AddProperty(&two_sided, 1, AI_MATKEY_TWOSIDED);
    }

    //default texture
    if (!defaultTexture.empty())
    {
      const aiString name(defaultTexture.c_str());
      pcHelper->AddProperty(&name, _AI_MATKEY_TEXTURE_BASE, aiTextureType_DIFFUSE, 0);
    }

    //set to wireframe, so when using this material info we can switch to points rendering
    if (pointsOnly)
    {
      const int wireframe = 1;
      pcHelper->AddProperty(&wireframe, 1, AI_MATKEY_ENABLE_WIREFRAME);
    }

    pvOut->push_back(pcHelper);
  }
}